

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void constructAutomaticIndex(Parse *pParse,WhereClause *pWC,Bitmask notReady,WhereLevel *pLevel)

{
  long lVar1;
  Vdbe *p;
  Table *pTVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  Index *pIVar9;
  CollSeq *pCVar10;
  long in_RCX;
  long *in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  Subquery *pSubq;
  int regYield;
  Expr *pX;
  Bitmask cMask_1;
  int iCol_1;
  Bitmask cMask;
  int iCol;
  Expr *pExpr;
  int regBase;
  int addrCounter;
  SrcItem *pSrc;
  SrcList *pTabList;
  int iContinue;
  Expr *pPartial;
  u8 useBloomFilter;
  u8 sentWarning;
  Bitmask extraCols;
  Bitmask idxCols;
  WhereLoop *pLoop;
  CollSeq *pColl;
  int mxBitCol;
  int i;
  int n;
  int regRecord;
  int addrTop;
  Table *pTable;
  int addrInit;
  Vdbe *v;
  Index *pIdx;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  int nKeyCol;
  char *zNotUsed;
  Parse *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  Parse *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int iDataCur;
  Parse *in_stack_fffffffffffffed8;
  Parse *in_stack_fffffffffffffee0;
  Index *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Parse *in_stack_ffffffffffffff00;
  Parse *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  Parse *in_stack_ffffffffffffff18;
  Expr *pEVar11;
  undefined4 uVar12;
  ulong local_a0;
  ulong local_98;
  int local_78;
  int local_74;
  long *local_40;
  int local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = 0;
  pEVar11 = (Expr *)0x0;
  p = in_RDI->pVdbe;
  sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  local_34 = 0;
  lVar7 = *(long *)(*in_RSI + 8) + 8 + (ulong)*(byte *)(in_RCX + 0x40) * 0x48;
  pTVar2 = *(Table **)(lVar7 + 0x10);
  plVar8 = (long *)(in_RSI[4] + (long)*(int *)((long)in_RSI + 0x14) * 0x38);
  lVar3 = *(long *)(in_RCX + 0x60);
  local_98 = 0;
  for (local_40 = (long *)in_RSI[4]; local_40 < plVar8; local_40 = local_40 + 7) {
    if (((*(ushort *)((long)local_40 + 0x12) & 2) == 0) &&
       (iVar5 = sqlite3ExprIsSingleTableConstraint
                          ((Expr *)in_stack_fffffffffffffec8,(SrcList *)in_stack_fffffffffffffec0,
                           in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8), iVar5 != 0)) {
      in_stack_fffffffffffffee0 = in_RDI;
      sqlite3ExprDup((sqlite3 *)in_stack_fffffffffffffec0,
                     (Expr *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     in_stack_fffffffffffffeb4);
      pEVar11 = sqlite3ExprAnd(in_stack_fffffffffffffec8,(Expr *)in_stack_fffffffffffffec0,
                               (Expr *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                              );
    }
    iVar5 = termCanDriveIndex((WhereTerm *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                              (SrcItem *)
                              CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                              (Bitmask)in_stack_fffffffffffffea8);
    if (iVar5 != 0) {
      iVar5 = (int)local_40[4];
      if (iVar5 < 0x40) {
        in_stack_fffffffffffffed8 = (Parse *)(1L << ((byte)iVar5 & 0x3f));
      }
      else {
        in_stack_fffffffffffffed8 = (Parse *)0x8000000000000000;
      }
      in_stack_ffffffffffffff18 = in_stack_fffffffffffffed8;
      if ((char)((uint)uVar12 >> 0x18) == '\0') {
        sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar2->zName,pTVar2->aCol[iVar5].zCnName);
        uVar12 = CONCAT13(1,(int3)uVar12);
      }
      if ((local_98 & (ulong)in_stack_ffffffffffffff18) == 0) {
        iVar5 = whereLoopResize((sqlite3 *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                (WhereLoop *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        if (iVar5 != 0) goto LAB_001f9cbe;
        *(long **)(*(long *)(lVar3 + 0x40) + (long)local_34 * 8) = local_40;
        local_98 = (ulong)in_stack_ffffffffffffff18 | local_98;
        local_34 = local_34 + 1;
      }
    }
  }
  *(short *)(lVar3 + 0x34) = (short)local_34;
  *(short *)(lVar3 + 0x18) = (short)local_34;
  *(undefined4 *)(lVar3 + 0x30) = 0x4241;
  if (pTVar2->eTabType == '\x02') {
    local_a0 = local_98 ^ 0xffffffffffffffff;
  }
  else {
    local_a0 = *(ulong *)(lVar7 + 0x20) & (local_98 ^ 0xffffffffffffffff | 0x8000000000000000);
  }
  if ((pTVar2->tabFlags & 0x80) != 0) {
    for (local_78 = 0; local_78 < pTVar2->nCol; local_78 = local_78 + 1) {
      if ((pTVar2->aCol[local_78].colFlags & 1) != 0) {
        if (0x3e < local_78) {
          local_a0 = local_a0 | 0x8000000000000000;
          break;
        }
        if ((local_98 & 1L << ((byte)local_78 & 0x3f)) == 0) {
          local_a0 = 1L << ((byte)local_78 & 0x3f) | local_a0;
        }
      }
    }
  }
  if (pTVar2->nCol < 0x40) {
    iVar5 = (int)pTVar2->nCol;
  }
  else {
    iVar5 = 0x3f;
  }
  for (local_78 = 0; local_78 < iVar5; local_78 = local_78 + 1) {
  }
  iDataCur = iVar5;
  pIVar9 = sqlite3AllocateIndexObject
                     ((sqlite3 *)CONCAT44(iVar5,in_stack_fffffffffffffed0),
                      (i16)((ulong)in_stack_fffffffffffffec8 >> 0x30),(int)in_stack_fffffffffffffec8
                      ,(char **)in_stack_fffffffffffffec0);
  if (pIVar9 != (Index *)0x0) {
    *(Index **)(lVar3 + 0x20) = pIVar9;
    pIVar9->zName = "auto-index";
    pIVar9->pTable = pTVar2;
    local_74 = 0;
    local_98 = 0;
    for (local_40 = (long *)in_RSI[4]; cVar4 = (char)((uint)uVar12 >> 0x10), local_40 < plVar8;
        local_40 = local_40 + 7) {
      iVar6 = termCanDriveIndex((WhereTerm *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                (SrcItem *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                (Bitmask)in_stack_fffffffffffffea8);
      if (iVar6 != 0) {
        in_stack_ffffffffffffff14 = (int)local_40[4];
        if (in_stack_ffffffffffffff14 < 0x40) {
          in_stack_fffffffffffffec8 = (Parse *)(1L << ((byte)in_stack_ffffffffffffff14 & 0x3f));
        }
        else {
          in_stack_fffffffffffffec8 = (Parse *)0x8000000000000000;
        }
        in_stack_ffffffffffffff08 = in_stack_fffffffffffffec8;
        if ((local_98 & (ulong)in_stack_fffffffffffffec8) == 0) {
          in_stack_ffffffffffffff00 = (Parse *)*local_40;
          local_98 = (ulong)in_stack_fffffffffffffec8 | local_98;
          pIVar9->aiColumn[local_74] = (i16)(int)local_40[4];
          pCVar10 = sqlite3ExprCompareCollSeq(in_stack_fffffffffffffea8,(Expr *)0x1f965b);
          if (pCVar10 == (CollSeq *)0x0) {
            in_stack_fffffffffffffec0 = "BINARY";
          }
          else {
            in_stack_fffffffffffffec0 = pCVar10->zName;
          }
          pIVar9->azColl[local_74] = in_stack_fffffffffffffec0;
          local_74 = local_74 + 1;
          if ((in_stack_ffffffffffffff00->pVdbe != (Vdbe *)0x0) &&
             (cVar4 = sqlite3ExprAffinity((Expr *)in_stack_fffffffffffffea8), cVar4 != 'B')) {
            uVar12 = 0x10000;
          }
        }
      }
    }
    for (local_78 = 0; local_78 < iVar5; local_78 = local_78 + 1) {
      if ((local_a0 & 1L << ((byte)local_78 & 0x3f)) != 0) {
        pIVar9->aiColumn[local_74] = (i16)local_78;
        pIVar9->azColl[local_74] = "BINARY";
        local_74 = local_74 + 1;
      }
    }
    if ((*(ulong *)(lVar7 + 0x20) & 0x8000000000000000) != 0) {
      for (local_78 = 0x3f; local_78 < pTVar2->nCol; local_78 = local_78 + 1) {
        pIVar9->aiColumn[local_74] = (i16)local_78;
        pIVar9->azColl[local_74] = "BINARY";
        local_74 = local_74 + 1;
      }
    }
    if ((pTVar2->tabFlags & 0x80) == 0) {
      pIVar9->aiColumn[local_74] = -1;
      pIVar9->azColl[local_74] = "BINARY";
    }
    iVar5 = in_RDI->nTab;
    in_RDI->nTab = iVar5 + 1;
    *(int *)(in_RCX + 8) = iVar5;
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8
                      ,0);
    sqlite3VdbeSetP4KeyInfo
              ((Parse *)in_stack_fffffffffffffec0,
               (Index *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (((in_RDI->db->dbOptFlags & 0x80000) == 0) && (cVar4 != '\0')) {
      sqlite3WhereExplainBloomFilter
                (in_stack_ffffffffffffff18,
                 (WhereInfo *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (WhereLevel *)in_stack_ffffffffffffff08);
      iVar5 = in_RDI->nMem + 1;
      in_RDI->nMem = iVar5;
      *(int *)(in_RCX + 0x34) = iVar5;
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                        (int)in_stack_fffffffffffffea8,0);
    }
    iVar5 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    if ((*(ushort *)(lVar7 + 0x19) >> 6 & 1) == 0) {
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar5,
                        (int)in_stack_fffffffffffffea8);
    }
    else {
      in_stack_fffffffffffffef0 = *(Index **)(lVar7 + 0x40);
      in_stack_fffffffffffffefc = *(undefined4 *)((long)&in_stack_fffffffffffffef0->aiColumn + 4);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar5,
                        (int)in_stack_fffffffffffffea8,0);
      sqlite3VdbeAddOp3((Vdbe *)in_stack_fffffffffffffec8,
                        (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                        (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                        in_stack_fffffffffffffeb8);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                        (int)in_stack_fffffffffffffea8);
    }
    if (pEVar11 != (Expr *)0x0) {
      sqlite3VdbeMakeLabel(in_RDI);
      sqlite3ExprIfFalse(in_stack_ffffffffffffff00,
                         (Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                         (int)in_stack_fffffffffffffef0);
      *(uint *)(lVar3 + 0x30) = *(uint *)(lVar3 + 0x30) | 0x20000;
    }
    iVar5 = sqlite3GetTempReg(in_RDI);
    in_stack_fffffffffffffea8 = (Parse *)0x0;
    in_stack_fffffffffffffeb0 = 0;
    sqlite3GenerateIndexKey
              (in_stack_fffffffffffffee0,(Index *)in_stack_fffffffffffffed8,iDataCur,
               in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (int *)in_stack_fffffffffffffec0,in_stack_fffffffffffffef0,in_stack_fffffffffffffef8)
    ;
    if (*(int *)(in_RCX + 0x34) != 0) {
      sqlite3VdbeAddOp4Int
                ((Vdbe *)in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                 (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                 in_stack_fffffffffffffeb4);
    }
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8
                      ,0);
    sqlite3VdbeChangeP5(p,0x10);
    if (pEVar11 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel((Vdbe *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    }
    iVar6 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    if ((*(ushort *)(lVar7 + 0x19) >> 6 & 1) == 0) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar6,
                        (int)in_stack_fffffffffffffea8,0);
      sqlite3VdbeChangeP5(p,3);
    }
    else {
      sqlite3VdbeChangeP2((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          iVar6,(int)in_stack_fffffffffffffea8);
      translateColumnToCopy
                ((Parse *)CONCAT44(iDataCur,in_stack_fffffffffffffed0),
                 (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8,
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(int)in_stack_fffffffffffffec0);
      sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      *(ushort *)(lVar7 + 0x19) = *(ushort *)(lVar7 + 0x19) & 0xffbf;
    }
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    sqlite3ReleaseTempReg(in_RDI,iVar5);
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  }
LAB_001f9cbe:
  sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    (Expr *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  const Bitmask notReady,     /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warning has been issued */
  u8 useBloomFilter = 0;      /* True to also add a Bloom filter */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  SrcList *pTabList;          /* The complete FROM clause */
  SrcItem *pSrc;              /* The FROM clause term to get the next index */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExp = 0;            /* Address of OP_Explain */
#endif

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTabList = pWC->pWInfo->pTabList;
  pSrc = &pTabList->a[pLevel->iFrom];
  pTable = pSrc->pSTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    /* Make the automatic index a partial index if there are terms in the
    ** WHERE clause (or the ON clause of a LEFT join) that constrain which
    ** rows of the target table (pSrc) that can be used. */
    if( (pTerm->wtFlags & TERM_VIRTUAL)==0
     && sqlite3ExprIsSingleTableConstraint(pExpr, pTabList, pLevel->iFrom, 0)
    ){
      pPartial = sqlite3ExprAnd(pParse, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zCnName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 || pParse->db->mallocFailed );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  if( IsView(pTable) ){
    extraCols = ALLBITS & ~idxCols;
  }else{
    extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  }
  if( !HasRowid(pTable) ){
    /* For WITHOUT ROWID tables, ensure that all PRIMARY KEY columns are
    ** either in the idxCols mask or in the extraCols mask */
    for(i=0; i<pTable->nCol; i++){
      if( (pTable->aCol[i].colFlags & COLFLAG_PRIMKEY)==0 ) continue;
      if( i>=BMS-1 ){
        extraCols |= MASKBIT(BMS-1);
        break;
      }
      if( idxCols & MASKBIT(i) ) continue;
      extraCols |= MASKBIT(i);
    }
  }
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+HasRowid(pTable),
                                    0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.x.leftColumn;
        pColl = sqlite3ExprCompareCollSeq(pParse, pX);
        assert( pColl!=0 || pParse->nErr>0 ); /* TH3 collate01.800 */
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
        if( ALWAYS(pX->pLeft!=0)
         && sqlite3ExprAffinity(pX->pLeft)!=SQLITE_AFF_TEXT
        ){
          /* TUNING: only use a Bloom filter on an automatic index
          ** if one or more key columns has the ability to hold numeric
          ** values, since strings all have the same hash in the Bloom
          ** filter implementation and hence a Bloom filter on a text column
          ** is not usually helpful. */
          useBloomFilter = 1;
        }
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  if( HasRowid(pTable) ){
    pIdx->aiColumn[n] = XN_ROWID;
    pIdx->azColl[n] = sqlite3StrBINARY;
  }

  /* Create the automatic index */
  explainAutomaticIndex(pParse, pIdx, pPartial!=0, &addrExp);
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));
  if( OptimizationEnabled(pParse->db, SQLITE_BloomFilter) && useBloomFilter ){
    sqlite3WhereExplainBloomFilter(pParse, pWC->pWInfo, pLevel);
    pLevel->regFilter = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Blob, 10000, pLevel->regFilter);
  }

  /* Fill the automatic index with content */
  assert( pSrc == &pWC->pWInfo->pTabList->a[pLevel->iFrom] );
  if( pSrc->fg.viaCoroutine ){
    int regYield;
    Subquery *pSubq;
    assert( pSrc->fg.isSubquery );
    pSubq = pSrc->u4.pSubq;
    assert( pSubq!=0 );
    regYield = pSubq->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pSubq->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pSrc->pSTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  if( pLevel->regFilter ){
    sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0,
                         regBase, pLoop->u.btree.nEq);
  }
  sqlite3VdbeScanStatusCounters(v, addrExp, addrExp, sqlite3VdbeCurrentAddr(v));
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pSrc->fg.viaCoroutine ){
    assert( pSrc->fg.isSubquery && pSrc->u4.pSubq!=0 );
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    assert( pLevel->iIdxCur>0 );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pSrc->u4.pSubq->regResult, pLevel->iIdxCur);
    sqlite3VdbeGoto(v, addrTop);
    pSrc->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
    sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  }
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);

  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);
  sqlite3VdbeScanStatusRange(v, addrExp, addrExp, -1);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}